

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O1

void on_underlying_amqp_management_open_complete
               (void *context,AMQP_MANAGEMENT_OPEN_RESULT open_result)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE_00;
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE_00 == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar4 = "on_underlying_amqp_management_open_complete called with NULL context";
    iVar1 = 0x5d;
  }
  else {
    switch(*(undefined4 *)((long)context + 8)) {
    case 0:
    case 3:
      UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE_00 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar4 = "Unexpected AMQP management open complete";
      iVar1 = 0x6b;
      break;
    case 1:
      if (open_result == AMQP_MANAGEMENT_OPEN_OK) {
        *(undefined4 *)((long)context + 8) = 2;
        UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x10);
        uVar3 = *(undefined8 *)((long)context + 0x18);
        uVar2 = 1;
      }
      else {
        if (open_result != AMQP_MANAGEMENT_OPEN_ERROR) {
          if (open_result == AMQP_MANAGEMENT_OPEN_CANCELLED) {
            *(undefined4 *)((long)context + 8) = 0;
            amqp_management_close(*context);
            UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x10);
            uVar3 = *(undefined8 *)((long)context + 0x18);
            uVar2 = 3;
            goto LAB_0010d47a;
          }
          UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE_00)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                       ,"on_underlying_amqp_management_open_complete",0x7a,1,
                       "Unknown AMQP management state");
          }
        }
        *(undefined4 *)((long)context + 8) = 0;
        amqp_management_close(*context);
        UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x10);
        uVar3 = *(undefined8 *)((long)context + 0x18);
        uVar2 = 2;
      }
LAB_0010d47a:
      (*UNRECOVERED_JUMPTABLE)(uVar3,uVar2);
      return;
    case 2:
      UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE_00 != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                   ,"on_underlying_amqp_management_open_complete",0x6f,1,
                   "Unexpected AMQP management open complete in OPEN");
      }
      *(undefined4 *)((long)context + 8) = 3;
      (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x28));
      return;
    default:
      UNRECOVERED_JUMPTABLE_00 = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE_00 == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar4 = "AMQP management open complete in unknown state";
      iVar1 = 0x66;
    }
  }
  (*UNRECOVERED_JUMPTABLE_00)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
             "on_underlying_amqp_management_open_complete",iVar1,1,pcVar4);
  return;
}

Assistant:

static void on_underlying_amqp_management_open_complete(void* context, AMQP_MANAGEMENT_OPEN_RESULT open_result)
{
    if (context == NULL)
    {
        /* Codes_SRS_CBS_01_105: [ When `on_amqp_management_open_complete` is called with NULL `context`, it shall do nothing. ]*/
        LogError("on_underlying_amqp_management_open_complete called with NULL context");
    }
    else
    {
        CBS_HANDLE cbs = (CBS_HANDLE)context;

        switch (cbs->cbs_state)
        {
        default:
            LogError("AMQP management open complete in unknown state");
            break;

        case CBS_STATE_CLOSED:
        case CBS_STATE_ERROR:
            LogError("Unexpected AMQP management open complete");
            break;

        case CBS_STATE_OPEN:
            LogError("Unexpected AMQP management open complete in OPEN");
            /* Codes_SRS_CBS_01_109: [ When `on_amqp_management_open_complete` is called when the CBS is OPEN, the callback `on_cbs_error` shall be called and the `on_cbs_error_context` shall be passed as argument. ]*/
            cbs->cbs_state = CBS_STATE_ERROR;
            cbs->on_cbs_error(cbs->on_cbs_error_context);
            break;

        case CBS_STATE_OPENING:
        {
            switch (open_result)
            {
            default:
                LogError("Unknown AMQP management state");

            case AMQP_MANAGEMENT_OPEN_ERROR:
                cbs->cbs_state = CBS_STATE_CLOSED;
                /* Codes_SRS_CBS_01_113: [ When `on_amqp_management_open_complete` reports a failure, the underlying AMQP management shall be closed by calling `amqp_management_close`. ]*/
                (void)amqp_management_close(cbs->amqp_management);
                /* Codes_SRS_CBS_01_107: [ If CBS is OPENING and `open_result` is `AMQP_MANAGEMENT_OPEN_ERROR` the callback `on_cbs_open_complete` shall be called with `CBS_OPEN_ERROR` and the `on_cbs_open_complete_context` shall be passed as argument. ]*/
                cbs->on_cbs_open_complete(cbs->on_cbs_open_complete_context, CBS_OPEN_ERROR);
                break;

            case AMQP_MANAGEMENT_OPEN_CANCELLED:
                cbs->cbs_state = CBS_STATE_CLOSED;
                /* Codes_SRS_CBS_01_113: [ When `on_amqp_management_open_complete` reports a failure, the underlying AMQP management shall be closed by calling `amqp_management_close`. ]*/
                (void)amqp_management_close(cbs->amqp_management);
                /* Codes_SRS_CBS_01_108: [ If CBS is OPENING and `open_result` is `AMQP_MANAGEMENT_OPEN_CANCELLED` the callback `on_cbs_open_complete` shall be called with `CBS_OPEN_CANCELLED` and the `on_cbs_open_complete_context` shall be passed as argument. ]*/
                cbs->on_cbs_open_complete(cbs->on_cbs_open_complete_context, CBS_OPEN_CANCELLED);
                break;

            case AMQP_MANAGEMENT_OPEN_OK:
                /* Codes_SRS_CBS_01_106: [ If CBS is OPENING and `open_result` is `AMQP_MANAGEMENT_OPEN_OK` the callback `on_cbs_open_complete` shall be called with `CBS_OPEN_OK` and the `on_cbs_open_complete_context` shall be passed as argument. ]*/
                cbs->cbs_state = CBS_STATE_OPEN;
                cbs->on_cbs_open_complete(cbs->on_cbs_open_complete_context, CBS_OPEN_OK);
                break;
            }
            break;
        }
        }
    }
}